

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::BuildMethod
          (DescriptorBuilder *this,MethodDescriptorProto *proto,ServiceDescriptor *parent,
          MethodDescriptor *result)

{
  Symbol symbol;
  string *psVar1;
  OptionsType *orig_options;
  undefined4 uStack_34;
  
  psVar1 = DescriptorPool::Tables::AllocateString(this->tables_,(proto->name_).ptr_);
  *(string **)result = psVar1;
  *(ServiceDescriptor **)(result + 0x10) = parent;
  psVar1 = DescriptorPool::Tables::AllocateString(this->tables_,*(string **)(parent + 8));
  std::__cxx11::string::_M_replace_aux((ulong)psVar1,psVar1->_M_string_length,0,'\x01');
  std::__cxx11::string::_M_append((char *)psVar1,**(ulong **)result);
  *(string **)(result + 8) = psVar1;
  ValidateSymbolName(this,(proto->name_).ptr_,psVar1,&proto->super_Message);
  *(undefined8 *)(result + 0x48) = 0;
  *(undefined8 *)(result + 0x50) = 0;
  *(undefined8 *)(result + 0x38) = 0;
  *(undefined8 *)(result + 0x40) = 0;
  *(undefined8 *)(result + 0x28) = 0;
  *(undefined8 *)(result + 0x30) = 0;
  *(undefined8 *)(result + 0x18) = 0;
  *(undefined8 *)(result + 0x20) = 0;
  if (((proto->_has_bits_).has_bits_[0] & 8) == 0) {
    *(undefined8 *)(result + 0x58) = 0;
  }
  else {
    orig_options = proto->options_;
    if (orig_options == (OptionsType *)0x0) {
      orig_options = (OptionsType *)&_MethodOptions_default_instance_;
    }
    AllocateOptionsImpl<google::protobuf::MethodDescriptor>
              (this,*(string **)(result + 8),*(string **)(result + 8),orig_options,result);
  }
  result[0x60] = (MethodDescriptor)proto->client_streaming_;
  result[0x61] = (MethodDescriptor)proto->server_streaming_;
  symbol._4_4_ = uStack_34;
  symbol.type = 7;
  symbol.field_1.method_descriptor = result;
  AddSymbol(this,*(string **)(result + 8),parent,*(string **)result,&proto->super_Message,symbol);
  return;
}

Assistant:

void DescriptorBuilder::BuildMethod(const MethodDescriptorProto& proto,
                                    const ServiceDescriptor* parent,
                                    MethodDescriptor* result) {
  result->name_    = tables_->AllocateString(proto.name());
  result->service_ = parent;

  string* full_name = tables_->AllocateString(parent->full_name());
  full_name->append(1, '.');
  full_name->append(*result->name_);
  result->full_name_ = full_name;

  ValidateSymbolName(proto.name(), *full_name, proto);

  // These will be filled in when cross-linking.
  result->input_type_.Init();
  result->output_type_.Init();

  // Copy options.
  if (!proto.has_options()) {
    result->options_ = NULL;  // Will set to default_instance later.
  } else {
    AllocateOptions(proto.options(), result);
  }

  result->client_streaming_ = proto.client_streaming();
  result->server_streaming_ = proto.server_streaming();

  AddSymbol(result->full_name(), parent, result->name(),
            proto, Symbol(result));
}